

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TypedefDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TypedefDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  SyntaxNode *local_80;
  SyntaxNode *local_70;
  size_t index_local;
  TypedefDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_70 = (SyntaxNode *)0x0;
    if (this != (TypedefDeclarationSyntax *)0xfffffffffffffff0) {
      local_70 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 1:
    token.kind = (this->typedefKeyword).kind;
    token._2_1_ = (this->typedefKeyword).field_0x2;
    token.numFlags.raw = (this->typedefKeyword).numFlags.raw;
    token.rawLen = (this->typedefKeyword).rawLen;
    token.info = (this->typedefKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    node = (SyntaxNode *)not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    local_80 = (SyntaxNode *)0x0;
    if (this != (TypedefDeclarationSyntax *)0xffffffffffffff98) {
      local_80 = &(this->dimensions).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 5:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TypedefDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return typedefKeyword;
        case 2: return type.get();
        case 3: return name;
        case 4: return &dimensions;
        case 5: return semi;
        default: return nullptr;
    }
}